

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_cross_containers.hpp
# Opt level: O3

void __thiscall spirv_cross::Compiler::parse_fixup(Compiler *this)

{
  Variant *this_00;
  TypedID<(spirv_cross::Types)0> *pTVar1;
  StorageClass SVar2;
  size_t sVar3;
  bool bVar4;
  uint32_t uVar5;
  SPIRConstant *pSVar6;
  _Hash_node_base *p_Var7;
  SPIRVariable *v;
  TypedID<(spirv_cross::Types)0> *pTVar8;
  
  sVar3 = (this->ir).ids_for_constant_or_variable.
          super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)0>_>.buffer_size;
  if (sVar3 != 0) {
    pTVar8 = (this->ir).ids_for_constant_or_variable.
             super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)0>_>.ptr;
    pTVar1 = pTVar8 + sVar3;
    do {
      this_00 = (this->ir).ids.super_VectorView<spirv_cross::Variant>.ptr + pTVar8->id;
      if (this_00->type == TypeVariable) {
        v = Variant::get<spirv_cross::SPIRVariable>(this_00);
        SVar2 = v->storage;
        if (((SVar2 < Function) && ((0x58U >> (SVar2 & 0x1f) & 1) != 0)) ||
           (SVar2 == StorageClassTaskPayloadWorkgroupEXT)) {
          uVar5 = (v->super_IVariant).self.id;
          SmallVector<unsigned_int,_8UL>::reserve
                    (&this->global_variables,
                     (this->global_variables).super_VectorView<unsigned_int>.buffer_size + 1);
          sVar3 = (this->global_variables).super_VectorView<unsigned_int>.buffer_size;
          (this->global_variables).super_VectorView<unsigned_int>.ptr[sVar3] = uVar5;
          (this->global_variables).super_VectorView<unsigned_int>.buffer_size = sVar3 + 1;
        }
        bVar4 = variable_storage_is_aliased(this,v);
        if (bVar4) {
          uVar5 = (v->super_IVariant).self.id;
          SmallVector<unsigned_int,_8UL>::reserve
                    (&this->aliased_variables,
                     (this->aliased_variables).super_VectorView<unsigned_int>.buffer_size + 1);
          sVar3 = (this->aliased_variables).super_VectorView<unsigned_int>.buffer_size;
          (this->aliased_variables).super_VectorView<unsigned_int>.ptr[sVar3] = uVar5;
          (this->aliased_variables).super_VectorView<unsigned_int>.buffer_size = sVar3 + 1;
        }
      }
      else if (this_00->type == TypeConstant) {
        pSVar6 = Variant::get<spirv_cross::SPIRConstant>(this_00);
        bVar4 = ParsedIR::has_decoration(&this->ir,(ID)(pSVar6->super_IVariant).self.id,BuiltIn);
        if (((bVar4) &&
            (uVar5 = ParsedIR::get_decoration
                               (&this->ir,(ID)(pSVar6->super_IVariant).self.id,BuiltIn),
            uVar5 == 0x19)) &&
           (p_Var7 = (this->ir).entry_points._M_h._M_before_begin._M_nxt,
           p_Var7 != (_Hash_node_base *)0x0)) {
          uVar5 = (pSVar6->super_IVariant).self.id;
          do {
            *(uint32_t *)&p_Var7[0x1d]._M_nxt = uVar5;
            *(uint32_t *)&p_Var7[0x1a]._M_nxt = (pSVar6->m).c[0].r[0].u32;
            *(uint32_t *)((long)&p_Var7[0x1a]._M_nxt + 4) = (pSVar6->m).c[0].r[1].u32;
            *(uint32_t *)&p_Var7[0x1b]._M_nxt = (pSVar6->m).c[0].r[2].u32;
            p_Var7 = p_Var7->_M_nxt;
          } while (p_Var7 != (_Hash_node_base *)0x0);
        }
      }
      pTVar8 = pTVar8 + 1;
    } while (pTVar8 != pTVar1);
  }
  return;
}

Assistant:

T *end() SPIRV_CROSS_NOEXCEPT
	{
		return ptr + buffer_size;
	}